

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edge-segments.cpp
# Opt level: O1

Point2 __thiscall msdfgen::CubicSegment::point(CubicSegment *this,double param)

{
  double value;
  Vector2 VVar1;
  Vector2 VVar2;
  Point2 PVar3;
  Vector2 local_78;
  Vector2 local_68;
  Vector2 local_58;
  Vector2 local_48;
  double local_38;
  double local_30;
  
  local_48.x = this->p[1].x;
  local_48.y = this->p[1].y;
  local_58.x = this->p[2].x;
  local_58.y = this->p[2].y;
  value = 1.0 - param;
  VVar1 = operator*(value,&local_48);
  local_68.x = VVar1.x;
  local_68.y = VVar1.y;
  VVar1 = operator*(param,&local_58);
  local_78.x = VVar1.x;
  local_78.y = VVar1.y;
  VVar1 = Vector2::operator+(&local_68,&local_78);
  local_48.x = this->p[0].x;
  local_48.y = this->p[0].y;
  local_58.x = this->p[1].x;
  local_58.y = this->p[1].y;
  VVar2 = operator*(value,&local_48);
  local_68.x = VVar2.x;
  local_68.y = VVar2.y;
  VVar2 = operator*(param,&local_58);
  local_78.x = VVar2.x;
  local_78.y = VVar2.y;
  VVar2 = Vector2::operator+(&local_68,&local_78);
  local_48.x = VVar2.x;
  local_48.y = VVar2.y;
  local_58.x = VVar1.x;
  local_58.y = VVar1.y;
  VVar2 = operator*(value,&local_48);
  local_68.x = VVar2.x;
  local_68.y = VVar2.y;
  VVar2 = operator*(param,&local_58);
  local_78.x = VVar2.x;
  local_78.y = VVar2.y;
  VVar2 = Vector2::operator+(&local_68,&local_78);
  local_30 = VVar2.x;
  local_38 = VVar2.y;
  local_48.x = this->p[2].x;
  local_48.y = this->p[2].y;
  local_58.x = this->p[3].x;
  local_58.y = this->p[3].y;
  VVar2 = operator*(value,&local_48);
  local_68.x = VVar2.x;
  local_68.y = VVar2.y;
  VVar2 = operator*(param,&local_58);
  local_78.x = VVar2.x;
  local_78.y = VVar2.y;
  VVar2 = Vector2::operator+(&local_68,&local_78);
  local_58.x = VVar2.x;
  local_58.y = VVar2.y;
  local_48.x = VVar1.x;
  local_48.y = VVar1.y;
  VVar1 = operator*(value,&local_48);
  local_68.x = VVar1.x;
  local_68.y = VVar1.y;
  VVar1 = operator*(param,&local_58);
  local_78.x = VVar1.x;
  local_78.y = VVar1.y;
  VVar1 = Vector2::operator+(&local_68,&local_78);
  local_48.x = local_30;
  local_48.y = local_38;
  local_58.x = VVar1.x;
  local_58.y = VVar1.y;
  VVar1 = operator*(value,&local_48);
  local_68.x = VVar1.x;
  local_68.y = VVar1.y;
  VVar1 = operator*(param,&local_58);
  local_78.x = VVar1.x;
  local_78.y = VVar1.y;
  VVar1 = Vector2::operator+(&local_68,&local_78);
  PVar3.x = VVar1.x;
  PVar3.y = VVar1.y;
  return PVar3;
}

Assistant:

Point2 CubicSegment::point(double param) const {
    Vector2 p12 = mix(p[1], p[2], param);
    return mix(mix(mix(p[0], p[1], param), p12, param), mix(p12, mix(p[2], p[3], param), param), param);
}